

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O2

bool __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::hasData
          (ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *this)

{
  element_type *peVar1;
  
  if (this->hostBufferIsPopulated == false) {
    switch(this->deviceBufferType) {
    case Attribute:
      peVar1 = (this->renderAttributeBuffer).
               super___shared_ptr<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      break;
    case Texture1d:
    case Texture2d:
    case Texture3d:
      peVar1 = (element_type *)
               (this->renderTextureBuffer).
               super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      break;
    default:
      goto switchD_001e3218_default;
    }
    if (peVar1 == (element_type *)0x0) {
switchD_001e3218_default:
      return false;
    }
  }
  return true;
}

Assistant:

bool ManagedBuffer<T>::hasData() {

  if (hostBufferIsPopulated) return true;
  if (deviceBufferType == DeviceBufferType::Attribute && renderAttributeBuffer) return true;
  if (deviceBufferType == DeviceBufferType::Texture1d && renderTextureBuffer) return true;
  if (deviceBufferType == DeviceBufferType::Texture2d && renderTextureBuffer) return true;
  if (deviceBufferType == DeviceBufferType::Texture3d && renderTextureBuffer) return true;
  return false;
}